

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Args::Args(Args *this,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  Argument *pAVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  optional<ritobin::BinUnhasher> *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  string_view aArgumentName_06;
  string_view aArgumentName_07;
  string_view aArgumentName_08;
  ArgumentParser program;
  path local_3a8;
  allocator<char> local_37d;
  int local_37c;
  any local_378;
  any local_368;
  any local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  char **local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  any local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  any local_2a8;
  any local_298;
  any local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  ArgumentParser local_238;
  any local_1b8;
  any local_1a8;
  any local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  path local_a8;
  path local_80;
  path local_58;
  
  this->keep_hashed = false;
  this->recursive = false;
  this->log = false;
  local_2b0 = &(this->dir).field_2;
  (this->dir)._M_dataplus._M_p = (pointer)local_2b0;
  (this->dir)._M_string_length = 0;
  (this->dir).field_2._M_local_buf[0] = '\0';
  local_330 = &this->input_file;
  local_2b8 = &(this->input_file).field_2;
  (this->input_file)._M_dataplus._M_p = (pointer)local_2b8;
  (this->input_file)._M_string_length = 0;
  (this->input_file).field_2._M_local_buf[0] = '\0';
  local_340 = &this->output_file;
  local_2c0 = &(this->output_file).field_2;
  (this->output_file)._M_dataplus._M_p = (pointer)local_2c0;
  (this->output_file)._M_string_length = 0;
  (this->output_file).field_2._M_local_buf[0] = '\0';
  local_338 = &this->input_dir;
  local_2c8 = &(this->input_dir).field_2;
  (this->input_dir)._M_dataplus._M_p = (pointer)local_2c8;
  (this->input_dir)._M_string_length = 0;
  (this->input_dir).field_2._M_local_buf[0] = '\0';
  local_2d0 = &(this->output_dir).field_2;
  (this->output_dir)._M_dataplus._M_p = (pointer)local_2d0;
  (this->output_dir)._M_string_length = 0;
  (this->output_dir).field_2._M_local_buf[0] = '\0';
  local_2d8 = &(this->input_format).field_2;
  (this->input_format)._M_dataplus._M_p = (pointer)local_2d8;
  (this->input_format)._M_string_length = 0;
  (this->input_format).field_2._M_local_buf[0] = '\0';
  local_2e0 = &(this->output_format).field_2;
  (this->output_format)._M_dataplus._M_p = (pointer)local_2e0;
  (this->output_format)._M_string_length = 0;
  (this->output_format).field_2._M_local_buf[0] = '\0';
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_348 = &this->output_dir;
  local_320 = &this->input_format;
  local_328 = &this->output_format;
  local_37c = argc;
  local_318 = argv;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"ritobin","");
  argparse::ArgumentParser::ArgumentParser(&local_238,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-k","--keep-hashed");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"do not run unhasher","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_148);
  local_288._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_288._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_288);
  local_198._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_198._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_198);
  pAVar4->mNumArgs = 0;
  if (local_198._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_198._M_manager)(_Op_destroy,&local_198,(_Arg *)0x0);
    local_198._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_288._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_288._M_manager)(_Op_destroy,&local_288,(_Arg *)0x0);
    local_288._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-r","--recursive");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"run on directory","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_168);
  local_298._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_298._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_298);
  local_1a8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_1a8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_1a8);
  pAVar4->mNumArgs = 0;
  if (local_1a8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_1a8._M_manager)(_Op_destroy,&local_1a8,(_Arg *)0x0);
    local_1a8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_298._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_298._M_manager)(_Op_destroy,&local_298,(_Arg *)0x0);
    local_298._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-v","--verbose");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"log more","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_188);
  local_2a8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_2a8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_2a8);
  local_1b8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_1b8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_1b8);
  pAVar4->mNumArgs = 0;
  if (local_1b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_1b8._M_manager)(_Op_destroy,&local_1b8,(_Arg *)0x0);
    local_1b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_2a8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_2a8._M_manager)(_Op_destroy,&local_2a8,(_Arg *)0x0);
    local_2a8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_238,"input");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"input file or directory","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_c8);
  pAVar4->field_0xbc = pAVar4->field_0xbc | 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_238,"output");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"output file or directory","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_278);
  paVar1 = &local_3a8._M_pathname.field_2;
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  local_2f0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_2f0._M_storage._M_ptr = (void *)0x0;
  local_2f0._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_2f0._M_storage._M_ptr =
       (undefined8 *)((long)local_2f0._M_storage._M_ptr + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p == paVar1) {
    *(undefined8 *)((long)local_2f0._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
    *(undefined8 *)((long)local_2f0._M_storage._M_ptr + 0x18) = local_3a8._M_pathname.field_2._8_8_;
  }
  else {
    *(pointer *)local_2f0._M_storage._M_ptr = local_3a8._M_pathname._M_dataplus._M_p;
    *(ulong *)((long)local_2f0._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
  }
  *(size_type *)((long)local_2f0._M_storage._M_ptr + 8) = local_3a8._M_pathname._M_string_length;
  local_3a8._M_pathname._M_string_length = 0;
  local_3a8._M_pathname.field_2._M_local_buf[0] = '\0';
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::any::operator=(&pAVar4->mDefaultValue,&local_2f0);
  if (local_2f0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_2f0._M_manager)(_Op_destroy,&local_2f0,(_Arg *)0x0);
    local_2f0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-i","--input-format");
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  local_358._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_358._M_storage._M_ptr = (void *)0x0;
  local_358._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_358._M_storage._M_ptr =
       (undefined8 *)((long)local_358._M_storage._M_ptr + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p == paVar1) {
    *(undefined8 *)((long)local_358._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
    *(undefined8 *)((long)local_358._M_storage._M_ptr + 0x18) = local_3a8._M_pathname.field_2._8_8_;
  }
  else {
    *(pointer *)local_358._M_storage._M_ptr = local_3a8._M_pathname._M_dataplus._M_p;
    *(ulong *)((long)local_358._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
  }
  *(size_type *)((long)local_358._M_storage._M_ptr + 8) = local_3a8._M_pathname._M_string_length;
  local_3a8._M_pathname._M_string_length = 0;
  local_3a8._M_pathname.field_2._M_local_buf[0] = '\0';
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::any::operator=(&pAVar4->mDefaultValue,&local_358);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"format of input file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_358._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_358._M_manager)(_Op_destroy,&local_358,(_Arg *)0x0);
    local_358._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-o","--output-format");
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  local_368._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_368._M_storage._M_ptr = (void *)0x0;
  local_368._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_368._M_storage._M_ptr =
       (undefined8 *)((long)local_368._M_storage._M_ptr + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p == paVar1) {
    *(undefined8 *)((long)local_368._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
    *(undefined8 *)((long)local_368._M_storage._M_ptr + 0x18) = local_3a8._M_pathname.field_2._8_8_;
  }
  else {
    *(pointer *)local_368._M_storage._M_ptr = local_3a8._M_pathname._M_dataplus._M_p;
    *(ulong *)((long)local_368._M_storage._M_ptr + 0x10) =
         CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                  local_3a8._M_pathname.field_2._M_local_buf[0]);
  }
  *(size_type *)((long)local_368._M_storage._M_ptr + 8) = local_3a8._M_pathname._M_string_length;
  local_3a8._M_pathname._M_string_length = 0;
  local_3a8._M_pathname.field_2._M_local_buf[0] = '\0';
  local_3a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::any::operator=(&pAVar4->mDefaultValue,&local_368);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"format of output file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_368._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_368._M_manager)(_Op_destroy,&local_368,(_Arg *)0x0);
    local_368._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_238,"-d","--dir-hashes");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_80,local_318,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_a8,(char (*) [7])0x139158,auto_format);
  std::filesystem::__cxx11::operator/(&local_3a8,&local_58,&local_a8);
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_310,&local_3a8,&local_37d);
  local_378._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_378._M_storage._M_ptr = (void *)0x0;
  local_378._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_378._M_storage._M_ptr =
       (undefined8 *)((long)local_378._M_storage._M_ptr + 0x10);
  paVar2 = &local_310.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p == paVar2) {
    *(undefined8 *)((long)local_378._M_storage._M_ptr + 0x10) =
         CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,local_310.field_2._M_local_buf[0]);
    *(undefined8 *)((long)local_378._M_storage._M_ptr + 0x18) = local_310.field_2._8_8_;
  }
  else {
    *(pointer *)local_378._M_storage._M_ptr = local_310._M_dataplus._M_p;
    *(ulong *)((long)local_378._M_storage._M_ptr + 0x10) =
         CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,local_310.field_2._M_local_buf[0]);
  }
  *(size_type *)((long)local_378._M_storage._M_ptr + 8) = local_310._M_string_length;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  local_310._M_dataplus._M_p = (pointer)paVar2;
  std::any::operator=(&pAVar4->mDefaultValue,&local_378);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"directory containing hashes","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar4->mHelp,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_378._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_378._M_manager)(_Op_destroy,&local_378,(_Arg *)0x0);
    local_378._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                             local_310.field_2._M_local_buf[0]) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_3a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  argparse::ArgumentParser::parse_args(&local_238,local_37c,local_318);
  aArgumentName._M_str = "--dir-hashes";
  aArgumentName._M_len = 0xc;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName);
  argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->dir,&local_3a8._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  aArgumentName_00._M_str = "--keep-hashed";
  aArgumentName_00._M_len = 0xd;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_00);
  bVar3 = argparse::Argument::get<bool>(pAVar4);
  this->keep_hashed = bVar3;
  aArgumentName_01._M_str = "--recursive";
  aArgumentName_01._M_len = 0xb;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_01);
  bVar3 = argparse::Argument::get<bool>(pAVar4);
  this->recursive = bVar3;
  aArgumentName_02._M_str = "--verbose";
  aArgumentName_02._M_len = 9;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_02);
  bVar3 = argparse::Argument::get<bool>(pAVar4);
  this->log = bVar3;
  aArgumentName_03._M_str = "--input-format";
  aArgumentName_03._M_len = 0xe;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_03);
  argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_320,&local_3a8._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  aArgumentName_04._M_str = "--output-format";
  aArgumentName_04._M_len = 0xf;
  pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_04);
  argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_328,&local_3a8._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  if (this->recursive == true) {
    aArgumentName_05._M_str = "input";
    aArgumentName_05._M_len = 5;
    pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_05);
    argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_338,&local_3a8._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    aArgumentName_06._M_str = "output";
    aArgumentName_06._M_len = 6;
    pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_06);
    argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
    this_01 = local_348;
  }
  else {
    aArgumentName_07._M_str = "input";
    aArgumentName_07._M_len = 5;
    pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_07);
    argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_330,&local_3a8._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    aArgumentName_08._M_str = "output";
    aArgumentName_08._M_len = 6;
    pAVar4 = argparse::ArgumentParser::operator[](&local_238,aArgumentName_08);
    argparse::Argument::get<std::__cxx11::string>(&local_3a8._M_pathname,pAVar4);
    this_01 = local_340;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,&local_3a8._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_3a8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_3a8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001567e0;
  *(undefined1 *)&p_Var5[8]._vptr__Sp_counted_base = 0;
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  this_00 = (this->unhasher).
            super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~_Rb_tree(&local_238.mArgumentMap._M_t);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&local_238.mOptionalArguments.
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&local_238.mPositionalArguments.
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.mProgramName._M_dataplus._M_p != &local_238.mProgramName.field_2) {
    operator_delete(local_238.mProgramName._M_dataplus._M_p,
                    local_238.mProgramName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Args(int argc, char** argv) {
        argparse::ArgumentParser program("ritobin");
        program.add_argument("-k", "--keep-hashed")
                .help("do not run unhasher")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-r", "--recursive")
                .help("run on directory")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-v", "--verbose")
                .help("log more")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("input")
                .help("input file or directory")
                .required();
        program.add_argument("output")
                .help("output file or directory")
                .default_value(std::string(""));
        program.add_argument("-i", "--input-format")
                .default_value(std::string(""))
                .help("format of input file");
        program.add_argument("-o", "--output-format")
                .default_value(std::string(""))
                .help("format of output file");
        program.add_argument("-d", "--dir-hashes")
                .default_value((fs::path(argv[0]).parent_path() / "hashes").generic_string())
                .help("directory containing hashes");
        try {
            program.parse_args(argc, argv);
            dir =  program.get<std::string>("--dir-hashes");
            keep_hashed = program.get<bool>("--keep-hashed");
            recursive = program.get<bool>("--recursive");
            log = program.get<bool>("--verbose");
            input_format = program.get<std::string>("--input-format");
            output_format = program.get<std::string>("--output-format");
            if (recursive) {
                input_dir = program.get<std::string>("input");
                output_dir = program.get<std::string>("output");
            } else {
                input_file = program.get<std::string>("input");
                output_file = program.get<std::string>("output");
            }
        } catch (const std::runtime_error& err) {
            std::cerr << err.what() << std::endl;
            std::cerr << program << std::endl;
            std::cerr << "Formats:" << std::endl;
            for (auto format: ritobin::io::DynamicFormat::list()) {
                std::cerr << "\t- " << format->name() << std::endl;
            }
            exit(-1);
        }
        unhasher = std::make_shared<std::optional<BinUnhasher>>(std::nullopt);
    }